

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O2

Vec2 __thiscall
tcu::TexVerifierUtil::computeNonNormalizedCoordBounds
          (TexVerifierUtil *this,bool normalizedCoords,int dim,float coord,int coordBits,int uvBits)

{
  Vec2 VVar1;
  undefined3 in_register_00000031;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Db;
  float fVar6;
  
  fVar3 = computeFloatingPointError(coord,coordBits);
  fVar6 = coord - fVar3;
  bVar2 = CONCAT31(in_register_00000031,normalizedCoords) != 0;
  if (bVar2) {
    fVar6 = fVar6 * (float)dim;
  }
  fVar3 = fVar3 + coord;
  if (bVar2) {
    fVar3 = fVar3 * (float)dim;
  }
  fVar4 = computeFixedPointError(uvBits);
  fVar5 = computeFixedPointError(uvBits);
  *(float *)this = fVar6 - fVar4;
  *(float *)(this + 4) = fVar5 + fVar3;
  VVar1.m_data[1] = extraout_XMM0_Db;
  VVar1.m_data[0] = fVar5 + fVar3;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 computeNonNormalizedCoordBounds (const bool normalizedCoords, const int dim, const float coord, const int coordBits, const int uvBits)
{
	const float		coordErr		= computeFloatingPointError(coord, coordBits);
	const float		minN			= coord - coordErr;
	const float		maxN			= coord + coordErr;
	const float		minA			= normalizedCoords ? minN*float(dim) : minN;
	const float		maxA			= normalizedCoords ? maxN*float(dim) : maxN;
	const float		minC			= minA - computeFixedPointError(uvBits);
	const float		maxC			= maxA + computeFixedPointError(uvBits);

	DE_ASSERT(minC <= maxC);

	return Vec2(minC, maxC);
}